

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::skipWhiteSpace(Parser *this)

{
  element_type *peVar1;
  bool bVar2;
  undefined1 local_48 [24];
  undefined1 local_30 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  Parser *this_local;
  
  local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  while( true ) {
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken((TokenBuffer *)&stack0xffffffffffffffe0);
    peVar1 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &stack0xffffffffffffffe0);
    local_48[0x17] = 0;
    bVar2 = false;
    if (peVar1->tokenType != EndOfFile) {
      std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
      ;
      TokenBuffer::currentToken((TokenBuffer *)local_30);
      local_48[0x17] = 1;
      peVar1 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_30);
      bVar2 = peVar1->tokenType == WhiteSpace;
    }
    if ((local_48[0x17] & 1) != 0) {
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
    }
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)&stack0xffffffffffffffe0);
    if (!bVar2) break;
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::nextToken((TokenBuffer *)local_48);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_48);
  }
  return;
}

Assistant:

void Parser::skipWhiteSpace() noexcept {
  while (
      this->tokenBuffer->currentToken()->tokenType != TokenType::EndOfFile
      && this->tokenBuffer->currentToken()->tokenType == TokenType::WhiteSpace) {
    this->tokenBuffer->nextToken();
  }
}